

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lightsamplers_test.cpp
# Opt level: O2

void __thiscall
BVHLightSampling_PdfMethod_Test::~BVHLightSampling_PdfMethod_Test
          (BVHLightSampling_PdfMethod_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(BVHLightSampling, PdfMethod) {
    RNG rng(5251);
    auto r = [&rng]() { return rng.Uniform<Float>(); };

    std::vector<LightHandle> lights;
    std::vector<ShapeHandle> tris;
    std::tie(lights, tris) = randomLights(20, Allocator());

    BVHLightSampler distrib(lights, Allocator());
    for (int i = 0; i < 100; ++i) {
        Point3f p{-1 + 3 * r(), -1 + 3 * r(), -1 + 3 * r()};
        Float u = rng.Uniform<Float>();
        Interaction intr(Point3fi(p), Normal3f(0, 0, 0), Point2f(0, 0));
        pstd::optional<SampledLight> sampledLight = distrib.Sample(intr, u);
        if (sampledLight)
            // It's actually legit to sometimes get no lights; as the bounds
            // tighten up as we get deeper in the tree, it may turn out that
            // the path we followed didn't have any lights after all.
            EXPECT_FLOAT_EQ(sampledLight->pdf, distrib.PDF(intr, sampledLight->light));
    }
}